

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O3

FloatRect __thiscall sf::Transform::transformRect(Transform *this,FloatRect *rectangle)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  FloatRect FVar14;
  Vector2f points [4];
  
  fVar3 = rectangle->left;
  fVar5 = rectangle->top;
  fVar7 = rectangle->height + fVar5;
  fVar2 = (float)*(undefined8 *)(this->m_matrix + 4);
  fVar8 = fVar7 * fVar2;
  fVar6 = (float)((ulong)*(undefined8 *)(this->m_matrix + 4) >> 0x20);
  fVar7 = fVar7 * fVar6;
  fVar9 = (float)*(undefined8 *)this->m_matrix;
  fVar4 = (float)((ulong)*(undefined8 *)this->m_matrix >> 0x20);
  fVar10 = (float)*(undefined8 *)(this->m_matrix + 0xc);
  fVar11 = (float)((ulong)*(undefined8 *)(this->m_matrix + 0xc) >> 0x20);
  points[1].y = fVar3 * fVar4 + fVar7 + fVar11;
  points[1].x = fVar3 * fVar9 + fVar8 + fVar10;
  fVar12 = rectangle->width + fVar3;
  fVar2 = fVar5 * fVar2;
  fVar5 = fVar5 * fVar6;
  fVar13 = fVar12 * fVar9;
  fVar12 = fVar12 * fVar4;
  fVar6 = fVar9 * fVar3 + fVar2 + fVar10;
  fVar9 = fVar11 + fVar4 * fVar3 + fVar5;
  points[2].x = fVar2 + fVar13 + fVar10;
  points[2].y = fVar5 + fVar12 + fVar11;
  points[3].x = fVar13 + fVar8 + fVar10;
  points[3].y = fVar12 + fVar7 + fVar11;
  lVar1 = 1;
  fVar3 = fVar6;
  fVar5 = fVar9;
  do {
    fVar2 = points[lVar1].x;
    fVar4 = fVar2;
    if ((fVar3 <= fVar2) && (fVar4 = fVar3, fVar6 < fVar2)) {
      fVar6 = fVar2;
    }
    fVar3 = points[lVar1].y;
    fVar2 = fVar3;
    if ((fVar5 <= fVar3) && (fVar2 = fVar5, fVar9 < fVar3)) {
      fVar9 = fVar3;
    }
    fVar5 = fVar2;
    lVar1 = lVar1 + 1;
    fVar3 = fVar4;
  } while (lVar1 != 4);
  FVar14.width = fVar6 - fVar4;
  FVar14.height = fVar9 - fVar5;
  FVar14.top = fVar5;
  FVar14.left = fVar4;
  return FVar14;
}

Assistant:

FloatRect Transform::transformRect(const FloatRect& rectangle) const
{
    // Transform the 4 corners of the rectangle
    const Vector2f points[] =
    {
        transformPoint(rectangle.left, rectangle.top),
        transformPoint(rectangle.left, rectangle.top + rectangle.height),
        transformPoint(rectangle.left + rectangle.width, rectangle.top),
        transformPoint(rectangle.left + rectangle.width, rectangle.top + rectangle.height)
    };

    // Compute the bounding rectangle of the transformed points
    float left = points[0].x;
    float top = points[0].y;
    float right = points[0].x;
    float bottom = points[0].y;
    for (int i = 1; i < 4; ++i)
    {
        if      (points[i].x < left)   left = points[i].x;
        else if (points[i].x > right)  right = points[i].x;
        if      (points[i].y < top)    top = points[i].y;
        else if (points[i].y > bottom) bottom = points[i].y;
    }

    return FloatRect(left, top, right - left, bottom - top);
}